

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O0

void Cba_BlastLess_rec(Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits,int *pYes,int *pNo)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int local_48;
  int local_44;
  int NoR;
  int No;
  int YesR;
  int Yes;
  int *pNo_local;
  int *pYes_local;
  int *piStack_20;
  int nBits_local;
  int *pArg1_local;
  int *pArg0_local;
  Gia_Man_t *pNew_local;
  
  _YesR = pNo;
  pNo_local = pYes;
  pYes_local._4_4_ = nBits;
  piStack_20 = pArg1;
  pArg1_local = pArg0;
  pArg0_local = (int *)pNew;
  if (nBits < 2) {
    if (nBits != 1) {
      __assert_fail("nBits == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaBlast.c"
                    ,0x117,"void Cba_BlastLess_rec(Gia_Man_t *, int *, int *, int, int *, int *)");
    }
    iVar2 = Abc_LitNot(*pArg0);
    iVar2 = Gia_ManHashAnd(pNew,iVar2,*piStack_20);
    piVar1 = pArg0_local;
    *pNo_local = iVar2;
    iVar2 = Abc_LitNot(*piStack_20);
    iVar2 = Gia_ManHashAnd((Gia_Man_t *)piVar1,iVar2,*pArg1_local);
    *_YesR = iVar2;
  }
  else {
    iVar2 = Abc_LitNot(pArg0[nBits + -1]);
    No = Gia_ManHashAnd(pNew,iVar2,piStack_20[pYes_local._4_4_ + -1]);
    piVar1 = pArg0_local;
    iVar2 = Abc_LitNot(piStack_20[pYes_local._4_4_ + -1]);
    local_44 = Gia_ManHashAnd((Gia_Man_t *)piVar1,iVar2,pArg1_local[pYes_local._4_4_ + -1]);
    if ((No == 1) || (local_44 == 1)) {
      *pNo_local = No;
      *_YesR = local_44;
    }
    else {
      Cba_BlastLess_rec((Gia_Man_t *)pArg0_local,pArg1_local,piStack_20,pYes_local._4_4_ + -1,&NoR,
                        &local_48);
      piVar1 = pArg0_local;
      iVar2 = No;
      iVar3 = Abc_LitNot(local_44);
      iVar3 = Gia_ManHashAnd((Gia_Man_t *)piVar1,iVar3,NoR);
      iVar3 = Gia_ManHashOr((Gia_Man_t *)piVar1,iVar2,iVar3);
      piVar1 = pArg0_local;
      iVar2 = local_44;
      *pNo_local = iVar3;
      iVar3 = Abc_LitNot(No);
      iVar3 = Gia_ManHashAnd((Gia_Man_t *)piVar1,iVar3,local_48);
      iVar2 = Gia_ManHashOr((Gia_Man_t *)piVar1,iVar2,iVar3);
      *_YesR = iVar2;
    }
  }
  return;
}

Assistant:

void Cba_BlastLess_rec( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits, int * pYes, int * pNo )
{
    if ( nBits > 1 )
    {
        int Yes = Gia_ManHashAnd( pNew, Abc_LitNot(pArg0[nBits-1]), pArg1[nBits-1] ), YesR;
        int No  = Gia_ManHashAnd( pNew, Abc_LitNot(pArg1[nBits-1]), pArg0[nBits-1] ), NoR;
        if ( Yes == 1 || No == 1 )
        {
            *pYes = Yes;
            *pNo  = No;
            return;
        }
        Cba_BlastLess_rec( pNew, pArg0, pArg1, nBits-1, &YesR, &NoR );
        *pYes = Gia_ManHashOr( pNew, Yes, Gia_ManHashAnd(pNew, Abc_LitNot(No),  YesR) );
        *pNo  = Gia_ManHashOr( pNew, No,  Gia_ManHashAnd(pNew, Abc_LitNot(Yes), NoR ) );
        return;
    }
    assert( nBits == 1 );
    *pYes = Gia_ManHashAnd( pNew, Abc_LitNot(pArg0[0]), pArg1[0] );
    *pNo  = Gia_ManHashAnd( pNew, Abc_LitNot(pArg1[0]), pArg0[0] );
}